

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_load_dict(ps_decoder_t *ps,char *dictfile,char *fdictfile,char *format)

{
  int iVar1;
  ps_config_t *config;
  char *val;
  dict_t *dict_00;
  dict2pid_t *pdVar2;
  ps_config_t *newconfig;
  hash_iter_t *search_it;
  dict_t *dict;
  dict2pid_t *d2p;
  char *format_local;
  char *fdictfile_local;
  char *dictfile_local;
  ps_decoder_t *ps_local;
  
  config = ps_config_init((ps_arg_t *)0x0);
  iVar1 = ps_config_bool(ps->config,"dictcase");
  ps_config_set_bool(config,"dictcase",iVar1);
  ps_config_set_str(config,"dict",dictfile);
  if (fdictfile == (char *)0x0) {
    val = ps_config_str(ps->config,"fdict");
    ps_config_set_str(config,"fdict",val);
  }
  else {
    ps_config_set_str(config,"fdict",fdictfile);
  }
  dict_00 = dict_init(config,ps->acmod->mdef);
  if (dict_00 == (dict_t *)0x0) {
    ps_config_free(config);
    ps_local._4_4_ = -1;
  }
  else {
    pdVar2 = dict2pid_build(ps->acmod->mdef,dict_00);
    if (pdVar2 == (dict2pid_t *)0x0) {
      ps_config_free(config);
      ps_local._4_4_ = -1;
    }
    else {
      ps_config_free(config);
      dict_free(ps->dict);
      ps->dict = dict_00;
      dict2pid_free(ps->d2p);
      ps->d2p = pdVar2;
      for (newconfig = (ps_config_t *)hash_table_iter(ps->searches); newconfig != (ps_config_t *)0x0
          ; newconfig = (ps_config_t *)hash_table_iter_next((hash_iter_t *)newconfig)) {
        iVar1 = (**(code **)(**(long **)&newconfig->ht->nocase + 0x18))
                          (*(undefined8 *)&newconfig->ht->nocase,dict_00,pdVar2);
        if (iVar1 < 0) {
          hash_table_iter_free((hash_iter_t *)newconfig);
          return -1;
        }
      }
      ps_local._4_4_ = 0;
    }
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_load_dict(ps_decoder_t *ps, char const *dictfile,
             char const *fdictfile, char const *format)
{
    dict2pid_t *d2p;
    dict_t *dict;
    hash_iter_t *search_it;
    ps_config_t *newconfig;

    (void)format;
    /* Create a new scratch config to load this dict (so existing one
     * won't be affected if it fails) */
    newconfig = ps_config_init(NULL);
    ps_config_set_bool(newconfig, "dictcase",
                       ps_config_bool(ps->config, "dictcase"));
    ps_config_set_str(newconfig, "dict", dictfile);
    if (fdictfile)
        ps_config_set_str(newconfig, "fdict", fdictfile);
    else
        ps_config_set_str(newconfig, "fdict",
                          ps_config_str(ps->config, "fdict"));

    /* Try to load it. */
    if ((dict = dict_init(newconfig, ps->acmod->mdef)) == NULL) {
        ps_config_free(newconfig);
        return -1;
    }

    /* Reinit the dict2pid. */
    if ((d2p = dict2pid_build(ps->acmod->mdef, dict)) == NULL) {
        ps_config_free(newconfig);
        return -1;
    }

    /* Success!  Update the existing config to reflect new dicts and
     * drop everything into place. */
    ps_config_free(newconfig);
    dict_free(ps->dict);
    ps->dict = dict;
    dict2pid_free(ps->d2p);
    ps->d2p = d2p;

    /* And tell all searches to reconfigure themselves. */
    for (search_it = hash_table_iter(ps->searches); search_it;
       search_it = hash_table_iter_next(search_it)) {
        if (ps_search_reinit(hash_entry_val(search_it->ent), dict, d2p) < 0) {
            hash_table_iter_free(search_it);
            return -1;
        }
    }

    return 0;
}